

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

bool testing::internal::ParseStringFlag<std::__cxx11::string>
               (char *str,char *flag,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  char *pcVar1;
  char *value_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  char *flag_local;
  char *str_local;
  
  pcVar1 = ParseFlagValue(str,flag,false);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)value,pcVar1);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

static bool ParseStringFlag(const char* str, const char* flag, String* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  *value = value_str;
  return true;
}